

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O3

bool __thiscall
dynamicgraph::SignalPtr<double,_int>::needUpdate(SignalPtr<double,_int> *this,int *t)

{
  int iVar1;
  SignalBase<int> *pSVar2;
  _func_int *p_Var3;
  undefined8 extraout_RDX;
  
  iVar1 = (*this->_vptr_SignalPtr[6])();
  if ((char)iVar1 == '\0') {
    p_Var3 = this->_vptr_SignalPtr[-3];
  }
  else {
    p_Var3 = this->_vptr_SignalPtr[-3];
    if (this->signalPtr != (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)p_Var3)) {
      pSVar2 = getAbstractPtr(this);
      iVar1 = (*pSVar2->_vptr_SignalBase[9])(pSVar2,t,extraout_RDX,pSVar2->_vptr_SignalBase[9]);
      return SUB41(iVar1,0);
    }
  }
  return (bool)(&this->field_0x2c)[(long)p_Var3];
}

Assistant:

bool SignalPtr<T, Time>::needUpdate(const Time &t) const {
  if ((isAbstractPluged()) && (!autoref())) {
    return getAbstractPtr()->needUpdate(t);
  } else
    return Signal<T, Time>::needUpdate(t);
}